

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.hpp
# Opt level: O2

void __thiscall BCL::debug_error::~debug_error(debug_error *this)

{
  std::__cxx11::string::~string((string *)&this->what_arg_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

debug_error(const std::string& what_arg) : what_arg_(what_arg) {}